

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  MemberAccessExpressionSyntax *pMVar1;
  DeepCloneVisitor visitor;
  Token local_40;
  Token local_30;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_40,
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  pMVar1 = BumpAllocator::
           emplace<slang::syntax::MemberAccessExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(ExpressionSyntax *)args,&local_40,&local_30);
  return (int)pMVar1;
}

Assistant:

static SyntaxNode* clone(const MemberAccessExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<MemberAccessExpressionSyntax>(
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.dot.deepClone(alloc),
        node.name.deepClone(alloc)
    );
}